

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_equation_units.cpp
# Opt level: O3

void __thiscall otherEqUnits_trits_Test::~otherEqUnits_trits_Test(otherEqUnits_trits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(otherEqUnits, trits)
{
    EXPECT_NEAR(
        convert(1.0, precise::data::trit, precise::data::bit_s),
        1.58496,
        0.00001);
    EXPECT_NEAR(
        convert(6.0, precise::data::trit, precise::data::bit_s), 9.5, 0.01);
    EXPECT_NEAR(
        convert(20.19, precise::data::trit, precise::data::bit_s), 32.0, 0.01);
    EXPECT_NEAR(
        convert(40.38, precise::data::trit, precise::data::digits),
        19.27,
        0.01);

    EXPECT_NEAR(
        convert(1.58496, precise::data::bit_s, precise::data::trit),
        1.0,
        0.00001);
    EXPECT_NEAR(
        convert(9.5, precise::data::bit_s, precise::data::trit), 6.0, 0.01);
    EXPECT_NEAR(
        convert(9, precise::data::digits, precise::data::trit), 18.86, 0.01);
}